

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  BtShared *pBVar1;
  Pager *pPager_00;
  MemPage *pMVar2;
  u8 uVar3;
  int iVar4;
  u32 uVar5;
  u32 uVar6;
  u32 *in_RDX;
  int in_ESI;
  Btree *in_RDI;
  MemPage *pPage1;
  BtLock *pIter;
  sqlite3 *pBlock;
  int rc;
  Pager *pPager;
  BtShared *pBt;
  Pager *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint uVar7;
  Pager *pPager_01;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint uVar8;
  BtLock *local_40;
  sqlite3 *local_38;
  uint local_2c;
  
  pBVar1 = in_RDI->pBt;
  pPager_00 = pBVar1->pPager;
  local_2c = 0;
  sqlite3BtreeEnter((Btree *)0x168a5f);
  if ((in_RDI->inTrans != '\x02') && ((in_RDI->inTrans != '\x01' || (in_ESI != 0)))) {
    if (((in_RDI->db->flags & 0x2000000) != 0) &&
       (uVar3 = sqlite3PagerIsreadonly(pPager_00), uVar3 == '\0')) {
      pBVar1->btsFlags = pBVar1->btsFlags & 0xfffe;
    }
    if (((pBVar1->btsFlags & 1) == 0) || (in_ESI == 0)) {
      local_38 = (sqlite3 *)0x0;
      if (((in_ESI == 0) || (pBVar1->inTransaction != '\x02')) && ((pBVar1->btsFlags & 0x80) == 0))
      {
        if (1 < in_ESI) {
          for (local_40 = pBVar1->pLock; local_40 != (BtLock *)0x0; local_40 = local_40->pNext) {
            if (local_40->pBtree != in_RDI) {
              local_38 = local_40->pBtree->db;
              break;
            }
          }
        }
      }
      else {
        local_38 = pBVar1->pWriter->db;
      }
      if (local_38 == (sqlite3 *)0x0) {
        local_2c = querySharedCacheTableLock(in_RDI,1,'\x01');
        if (local_2c == 0) {
          pBVar1->btsFlags = pBVar1->btsFlags & 0xffef;
          if (pBVar1->nPage == 0) {
            pBVar1->btsFlags = pBVar1->btsFlags | 0x10;
          }
          do {
            do {
              uVar8 = in_stack_ffffffffffffffb4 & 0xffffff;
              if (pBVar1->pPage1 == (MemPage *)0x0) {
                local_2c = lockBtree((BtShared *)
                                     (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                                     & 0xffffffffffffff));
                uVar8 = CONCAT13(local_2c == 0,(int3)uVar8);
              }
              in_stack_ffffffffffffffb4 = uVar8;
            } while ((char)(uVar8 >> 0x18) != '\0');
            if ((local_2c == 0) && (in_ESI != 0)) {
              if ((pBVar1->btsFlags & 1) == 0) {
                in_stack_ffffffffffffffb0 = (uint)(1 < in_ESI);
                pPager_01 = pPager_00;
                sqlite3TempInMemory(in_RDI->db);
                local_2c = sqlite3PagerBegin(pPager_01,in_stack_ffffffffffffffa4,
                                             in_stack_ffffffffffffffa0);
                if (local_2c == 0) {
                  local_2c = newDatabase((BtShared *)pPager_01);
                }
                else if ((local_2c == 0x205) && (pBVar1->inTransaction == '\0')) {
                  local_2c = 5;
                }
              }
              else {
                local_2c = 8;
              }
            }
            if (local_2c != 0) {
              unlockBtreeIfUnused((BtShared *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
            }
            uVar7 = in_stack_ffffffffffffffa4 & 0xffffff;
            if (((local_2c & 0xff) == 5) &&
               (uVar7 = in_stack_ffffffffffffffa4 & 0xffffff, pBVar1->inTransaction == '\0')) {
              iVar4 = btreeInvokeBusyHandler
                                ((void *)(CONCAT44(in_stack_ffffffffffffffa4,
                                                   in_stack_ffffffffffffffa0) & 0xffffffffffffff));
              uVar7 = CONCAT13(iVar4 != 0,(int3)uVar7);
            }
            in_stack_ffffffffffffffa4 = uVar7;
            in_stack_ffffffffffffffb4 = uVar8;
          } while ((char)(uVar7 >> 0x18) != '\0');
          if (local_2c == 0) {
            if ((in_RDI->inTrans == '\0') &&
               (pBVar1->nTransaction = pBVar1->nTransaction + 1, in_RDI->sharable != '\0')) {
              (in_RDI->lock).eLock = '\x01';
              (in_RDI->lock).pNext = pBVar1->pLock;
              pBVar1->pLock = &in_RDI->lock;
            }
            uVar3 = '\x01';
            if (in_ESI != 0) {
              uVar3 = '\x02';
            }
            in_RDI->inTrans = uVar3;
            if (pBVar1->inTransaction < in_RDI->inTrans) {
              pBVar1->inTransaction = in_RDI->inTrans;
            }
            if (in_ESI != 0) {
              pMVar2 = pBVar1->pPage1;
              pBVar1->pWriter = in_RDI;
              pBVar1->btsFlags = pBVar1->btsFlags & 0xffbf;
              if (1 < in_ESI) {
                pBVar1->btsFlags = pBVar1->btsFlags | 0x40;
              }
              uVar6 = pBVar1->nPage;
              uVar5 = sqlite3Get4byte(pMVar2->aData + 0x1c);
              if ((uVar6 != uVar5) &&
                 (local_2c = sqlite3PagerWrite((PgHdr *)in_stack_ffffffffffffff98), local_2c == 0))
              {
                sqlite3Put4byte(pMVar2->aData + 0x1c,pBVar1->nPage);
              }
            }
          }
        }
      }
      else {
        local_2c = 0x106;
      }
    }
    else {
      local_2c = 8;
    }
  }
  if (local_2c == 0) {
    if (in_RDX != (u32 *)0x0) {
      uVar6 = sqlite3Get4byte(pBVar1->pPage1->aData + 0x28);
      *in_RDX = uVar6;
    }
    if (in_ESI != 0) {
      local_2c = sqlite3PagerOpenSavepoint(in_stack_ffffffffffffff98,0);
    }
  }
  sqlite3BtreeLeave((Btree *)0x168eeb);
  return local_2c;
}

Assistant:

static SQLITE_NOINLINE int btreeBeginTrans(
  Btree *p,                 /* The btree in which to start the transaction */
  int wrflag,               /* True to start a write transaction */
  int *pSchemaVersion       /* Put schema version number here, if not NULL */
){
  BtShared *pBt = p->pBt;
  Pager *pPager = pBt->pPager;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  if( (p->db->flags & SQLITE_ResetDatabase)
   && sqlite3PagerIsreadonly(pPager)==0
  ){
    pBt->btsFlags &= ~BTS_READ_ONLY;
  }

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on
  ** page 1. So if some other shared-cache client already has a write-lock
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, SCHEMA_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    sqlite3PagerWalDb(pPager, p->db);

#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    /* If transitioning from no transaction directly to a write transaction,
    ** block for the WRITER lock first if possible. */
    if( pBt->pPage1==0 && wrflag ){
      assert( pBt->inTransaction==TRANS_NONE );
      rc = sqlite3PagerWalWriteLock(pPager, 1);
      if( rc!=SQLITE_BUSY && rc!=SQLITE_OK ) break;
    }
#endif

    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pPager, wrflag>1, sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }else if( rc==SQLITE_BUSY_SNAPSHOT && pBt->inTransaction==TRANS_NONE ){
          /* if there was no transaction opened when this function was
          ** called and SQLITE_BUSY_SNAPSHOT is returned, change the error
          ** code to SQLITE_BUSY. */
          rc = SQLITE_BUSY;
        }
      }
    }

    if( rc!=SQLITE_OK ){
      (void)sqlite3PagerWalWriteLock(pPager, 0);
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );
  sqlite3PagerWalDb(pPager, 0);
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }

trans_begun:
  if( rc==SQLITE_OK ){
    if( pSchemaVersion ){
      *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
    }
    if( wrflag ){
      /* This call makes sure that the pager has the correct number of
      ** open savepoints. If the second parameter is greater than 0 and
      ** the sub-journal is not already open, then it will be opened here.
      */
      rc = sqlite3PagerOpenSavepoint(pPager, p->db->nSavepoint);
    }
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}